

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumberObject.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptNumberObject::GetDiagValueString
          (JavascriptNumberObject *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  charcount_t countNeeded;
  char16 *str;
  double value;
  JavascriptString *local_28;
  JavascriptString *valueStr;
  
  EnterPinnedScope(&local_28);
  value = GetValue(this);
  local_28 = JavascriptNumber::ToStringRadix10
                       (value,(((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                              ptr);
  str = JavascriptString::GetString(local_28);
  countNeeded = JavascriptString::GetLength(local_28);
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,str,countNeeded);
  LeavePinnedScope();
  return 1;
}

Assistant:

BOOL JavascriptNumberObject::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        ENTER_PINNED_SCOPE(JavascriptString, valueStr);
        valueStr = JavascriptNumber::ToStringRadix10(this->GetValue(), GetScriptContext());
        stringBuilder->Append(valueStr->GetString(), valueStr->GetLength());
        LEAVE_PINNED_SCOPE();
        return TRUE;
    }